

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tconcat(lua_State *L)

{
  lua_Integer lVar1;
  char *s;
  lua_Integer i;
  size_t lsep;
  luaL_Buffer b;
  
  checktab(L,1,5);
  lVar1 = luaL_len(L,1);
  s = luaL_optlstring(L,2,"",&lsep);
  i = luaL_optinteger(L,3,1);
  lVar1 = luaL_optinteger(L,4,lVar1);
  luaL_buffinit(L,&b);
  for (; i < lVar1; i = i + 1) {
    addfield(L,&b,i);
    luaL_addlstring(&b,s,lsep);
  }
  if (i == lVar1) {
    addfield(L,&b,lVar1);
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int tconcat(lua_State *L) {
    luaL_Buffer b;
    lua_Integer last = aux_getn(L, 1, TAB_R);
    size_t lsep;
    const char *sep = luaL_optlstring(L, 2, "", &lsep);
    lua_Integer i = luaL_optinteger(L, 3, 1);
    last = luaL_optinteger(L, 4, last);
    luaL_buffinit(L, &b);
    for (; i < last; i++) {
        addfield(L, &b, i);
        luaL_addlstring(&b, sep, lsep);
    }
    if (i == last)  /* add last value (if interval was not empty) */
        addfield(L, &b, i);
    luaL_pushresult(&b);
    return 1;
}